

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int n;
  int local_20;
  int local_1c;
  int j;
  int i;
  int u_local;
  int l_local;
  lua_State *L_local;
  
  j = u;
  i = l;
  while( true ) {
    if (j <= i) {
      return;
    }
    lua_rawgeti(L,1,i);
    lua_rawgeti(L,1,j);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      set2(L,i,j);
    }
    if (j - i == 1) break;
    iVar1 = (i + j) / 2;
    lua_rawgeti(L,1,iVar1);
    lua_rawgeti(L,1,i);
    iVar2 = sort_comp(L,-2,-1);
    if (iVar2 == 0) {
      lua_settop(L,-2);
      lua_rawgeti(L,1,j);
      iVar2 = sort_comp(L,-1,-2);
      if (iVar2 == 0) {
        lua_settop(L,-3);
      }
      else {
        set2(L,iVar1,j);
      }
    }
    else {
      set2(L,iVar1,i);
    }
    if (j - i == 2) {
      return;
    }
    lua_rawgeti(L,1,iVar1);
    lua_pushvalue(L,-1);
    lua_rawgeti(L,1,j + -1);
    set2(L,iVar1,j + -1);
    local_1c = i;
    local_20 = j + -1;
    while( true ) {
      while( true ) {
        iVar1 = local_1c;
        n = local_1c + 1;
        lua_rawgeti(L,1,n);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 == 0) break;
        if (j < n) {
          luaL_error(L,"invalid order function for sorting");
        }
        lua_settop(L,-2);
        local_1c = n;
      }
      while( true ) {
        local_20 = local_20 + -1;
        lua_rawgeti(L,1,local_20);
        iVar2 = sort_comp(L,-3,-1);
        if (iVar2 == 0) break;
        if (local_20 < i) {
          luaL_error(L,"invalid order function for sorting");
        }
        lua_settop(L,-2);
      }
      if (local_20 < n) break;
      set2(L,n,local_20);
      local_1c = n;
    }
    lua_settop(L,-4);
    lua_rawgeti(L,1,j + -1);
    lua_rawgeti(L,1,n);
    set2(L,j + -1,n);
    if (n - i < j - n) {
      local_20 = i;
      i = local_1c + 2;
    }
    else {
      local_20 = local_1c + 2;
      local_1c = j;
      j = iVar1;
    }
    auxsort(L,local_20,local_1c);
  }
  return;
}

Assistant:

static void auxsort(lua_State*L,int l,int u){
while(l<u){
int i,j;
lua_rawgeti(L,1,l);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,l,u);
else
lua_pop(L,2);
if(u-l==1)break;
i=(l+u)/2;
lua_rawgeti(L,1,i);
lua_rawgeti(L,1,l);
if(sort_comp(L,-2,-1))
set2(L,i,l);
else{
lua_pop(L,1);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,i,u);
else
lua_pop(L,2);
}
if(u-l==2)break;
lua_rawgeti(L,1,i);
lua_pushvalue(L,-1);
lua_rawgeti(L,1,u-1);
set2(L,i,u-1);
i=l;j=u-1;
for(;;){
while(lua_rawgeti(L,1,++i),sort_comp(L,-1,-2)){
if(i>u)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
while(lua_rawgeti(L,1,--j),sort_comp(L,-3,-1)){
if(j<l)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
if(j<i){
lua_pop(L,3);
break;
}
set2(L,i,j);
}
lua_rawgeti(L,1,u-1);
lua_rawgeti(L,1,i);
set2(L,u-1,i);
if(i-l<u-i){
j=l;i=i-1;l=i+2;
}
else{
j=i+1;i=u;u=j-2;
}
auxsort(L,j,i);
}
}